

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O0

int psort_(double *a,int n,int *ind,int ni)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int local_178 [2];
  int indu [16];
  int indl [16];
  int local_ec;
  int tt;
  int ju;
  int iu [16];
  int local_9c;
  int iStack_98;
  int jl;
  int il [16];
  double dStack_50;
  int ij;
  double t;
  int local_40;
  int p;
  int m;
  int l;
  int k;
  int j;
  int i__;
  int ni_local;
  int *ind_local;
  int n_local;
  double *a_local;
  
  if ((((n < 0) || (ni < 0)) || (n < 2)) || (ni == 0)) {
    return 0;
  }
  local_9c = 1;
  indu[0xe] = 1;
  local_178[0] = ni;
  k = 1;
  local_40 = 1;
  local_ec = ni;
  l = n;
LAB_0017600b:
  iVar2 = local_40;
  if (l <= k) goto LAB_0017601a;
  do {
    m = k;
    il[0xf] = (k + l) / 2;
    dStack_50 = a[(long)il[0xf] + -1];
    if (dStack_50 < a[(long)k + -1]) {
      a[(long)il[0xf] + -1] = a[(long)k + -1];
      a[(long)k + -1] = dStack_50;
      dStack_50 = a[(long)il[0xf] + -1];
    }
    p = l;
    if (a[(long)l + -1] < dStack_50) {
      a[(long)il[0xf] + -1] = a[(long)l + -1];
      a[(long)l + -1] = dStack_50;
      dStack_50 = a[(long)il[0xf] + -1];
      if (dStack_50 < a[(long)k + -1]) {
        a[(long)il[0xf] + -1] = a[(long)k + -1];
        a[(long)k + -1] = dStack_50;
        dStack_50 = a[(long)il[0xf] + -1];
      }
    }
    while( true ) {
      do {
        p = p + -1;
      } while (dStack_50 < a[(long)p + -1]);
      dVar1 = a[(long)p + -1];
      do {
        m = m + 1;
      } while (a[(long)m + -1] < dStack_50);
      if (p < m) break;
      a[(long)p + -1] = a[(long)m + -1];
      a[(long)m + -1] = (double)(int)dVar1;
    }
    indu[(long)(local_40 + -1) + 0xe] = local_9c;
    local_178[local_40 + -1] = local_ec;
    iVar2 = local_40 + 1;
    if (l - m < p - k) {
      (&iStack_98)[local_40 + -1] = k;
      (&tt)[local_40 + -1] = p;
      for (; local_9c <= local_ec; local_9c = local_9c + 1) {
        if (m <= ind[(long)local_9c + -1]) {
          local_178[local_40 + -1] = local_9c + -1;
          local_40 = iVar2;
          k = m;
          goto LAB_00176095;
        }
      }
    }
    else {
      (&iStack_98)[local_40 + -1] = m;
      (&tt)[local_40 + -1] = l;
      for (; local_9c <= local_ec; local_ec = local_ec + -1) {
        if (ind[(long)local_ec + -1] <= p) {
          indu[(long)(local_40 + -1) + 0xe] = local_ec + 1;
          local_40 = iVar2;
          l = p;
          goto LAB_00176095;
        }
      }
    }
LAB_0017601a:
    while( true ) {
      do {
        local_40 = iVar2;
        iVar2 = local_40 + -1;
        if (iVar2 == 0) {
          return 0;
        }
        k = (&iStack_98)[local_40 + -2];
        l = (&tt)[local_40 + -2];
        local_9c = indu[(long)(local_40 + -2) + 0xe];
        local_ec = local_178[local_40 + -2];
        local_40 = iVar2;
      } while (local_ec < local_9c);
LAB_00176095:
      if (10 < l - k) break;
      if (k == 1) goto LAB_0017600b;
      k = k + -1;
      while (iVar3 = k + 1, iVar2 = local_40, iVar3 != l) {
        dVar1 = a[(long)(k + 2) + -1];
        k = iVar3;
        if (dVar1 < a[(long)iVar3 + -1]) {
          do {
            m = iVar3;
            a[(long)(m + 1) + -1] = a[(long)m + -1];
            iVar3 = m + -1;
          } while (dVar1 < a[(long)(m + -1) + -1]);
          a[(long)m + -1] = dVar1;
        }
      }
    }
  } while( true );
}

Assistant:

int psort_(double *a, int n, int *ind, int ni)
{
    int i__, j, k, l, m, p;
    double t;
    int ij, il[16], jl, iu[16], ju;
    int tt;
    int indl[16], indu[16];


/* Partial Sorting ; used for Median (MAD) computation only */

/* Arg */
/* Var */
    /* Parameter adjustments */
    --a;
    --ind;

    /* Function Body */
    if (n < 0 || ni < 0) {
	return 0;
    }
    if (n < 2 || ni == 0) {
	return 0;
    }
    jl = 1;
    ju = ni;
    indl[0] = 1;
    indu[0] = ni;
    i__ = 1;
    j = n;
    m = 1;
/* Outer Loop */
L161:
    if (i__ < j) {
	goto L10;
    }
/*  _Loop_ */
L166:
    --m;
    if (m == 0) {
	return 0;
    }
    i__ = il[m - 1];
    j = iu[m - 1];
    jl = indl[m - 1];
    ju = indu[m - 1];
    if (! (jl <= ju)) {
	goto L166;
    }
/*     while (j - i > 10) */
L173:
    if (! (j - i__ > 10)) {
	goto L174;
    }
L10:
    k = i__;
    ij = (i__ + j) / 2;
    t = a[ij];
    if (a[i__] > t) {
	a[ij] = a[i__];
	a[i__] = t;
	t = a[ij];
    }
    l = j;
    if (a[j] < t) {
	a[ij] = a[j];
	a[j] = t;
	t = a[ij];
	if (a[i__] > t) {
	    a[ij] = a[i__];
	    a[i__] = t;
	    t = a[ij];
	}
    }
L181:
    --l;
    if (a[l] <= t) {
	tt = a[l];
L186:
	++k;
/* L187: */
	if (! (a[k] >= t)) {
	    goto L186;
	}
	if (k > l) {
	    goto L183;
	}
	a[l] = a[k];
	a[k] = tt;
    }
/* L182: */
    goto L181;
L183:
    indl[m - 1] = jl;
    indu[m - 1] = ju;
    p = m;
    ++m;
    if (l - i__ <= j - k) {
	il[p - 1] = k;
	iu[p - 1] = j;
	j = l;
L193:
	if (jl > ju) {
	    goto L166;
	}
	if (ind[ju] > j) {
	    --ju;
	    goto L193;
	}
	indl[p - 1] = ju + 1;
    } else {
	il[p - 1] = i__;
	iu[p - 1] = l;
	i__ = k;
L200:
	if (jl > ju) {
	    goto L166;
	}
	if (ind[jl] < i__) {
	    ++jl;
	    goto L200;
	}
	indu[p - 1] = jl - 1;
    }
    goto L173;
/*     end while */
L174:
    if (i__ != 1) {
	--i__;
L209:
	++i__;
	if (i__ == j) {
	    goto L166;
	}
	t = a[i__ + 1];
	if (a[i__] > t) {
	    k = i__;
/*           repeat */
L216:
	    a[k + 1] = a[k];
	    --k;
	    if (! (t >= a[k])) {
		goto L216;
	    }
/*           until  t >= a(k) */
	    a[k + 1] = t;
	}
	goto L209;
    }
    goto L161;
/* End Outer Loop */
}